

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlChar *str;
  xmlChar *pxVar2;
  bool bVar3;
  bool bVar4;
  int local_24;
  int len;
  xmlChar *name;
  int lc;
  xmlXPathParserContextPtr ctxt_local;
  
  bVar4 = true;
  while( true ) {
    bVar3 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar3 = true, 10 < *ctxt->cur)))) {
      bVar3 = *ctxt->cur == '\r';
    }
    if (!bVar3) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  if (((((*ctxt->cur == '$') || (*ctxt->cur == '(')) || ((0x2f < *ctxt->cur && (*ctxt->cur < 0x3a)))
       ) || ((*ctxt->cur == '\'' || (*ctxt->cur == '\"')))) ||
     ((*ctxt->cur == '.' && ((0x2f < ctxt->cur[1] && (ctxt->cur[1] < 0x3a)))))) {
    bVar4 = false;
  }
  else if (*ctxt->cur == '*') {
    bVar4 = true;
  }
  else if (*ctxt->cur == '/') {
    bVar4 = true;
  }
  else if (*ctxt->cur == '@') {
    bVar4 = true;
  }
  else if (*ctxt->cur == '.') {
    bVar4 = true;
  }
  else {
    while( true ) {
      bVar3 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar3 = true, 10 < *ctxt->cur)))) {
        bVar3 = *ctxt->cur == '\r';
      }
      if (!bVar3) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    str = xmlXPathScanName(ctxt);
    if ((str == (xmlChar *)0x0) ||
       (pxVar2 = xmlStrstr(str,(xmlChar *)"::"), pxVar2 == (xmlChar *)0x0)) {
      if (str == (xmlChar *)0x0) {
        xmlXPathErr(ctxt,7);
        return;
      }
      for (local_24 = xmlStrlen(str); ctxt->cur[local_24] != '\0'; local_24 = local_24 + 1) {
        if (ctxt->cur[local_24] == '/') {
          bVar4 = true;
          break;
        }
        if ((ctxt->cur[local_24] != ' ') &&
           (((ctxt->cur[local_24] < 9 || (10 < ctxt->cur[local_24])) &&
            (ctxt->cur[local_24] != '\r')))) {
          if (ctxt->cur[local_24] == ':') {
            bVar4 = true;
          }
          else if (ctxt->cur[local_24] == '(') {
            iVar1 = xmlXPathIsNodeType(str);
            bVar4 = iVar1 != 0;
          }
          else if (ctxt->cur[local_24] == '[') {
            bVar4 = true;
          }
          else if (((ctxt->cur[local_24] == '<') || (ctxt->cur[local_24] == '>')) ||
                  (ctxt->cur[local_24] == '=')) {
            bVar4 = true;
          }
          else {
            bVar4 = true;
          }
          break;
        }
      }
      if (ctxt->cur[local_24] == '\0') {
        bVar4 = true;
      }
      (*xmlFree)(str);
    }
    else {
      bVar4 = true;
      (*xmlFree)(str);
    }
  }
  if (bVar4) {
    if (*ctxt->cur == '/') {
      xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_ROOT,0,0,0,(void *)0x0,(void *)0x0);
    }
    else {
      xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
    }
    xmlXPathCompLocationPath(ctxt);
  }
  else {
    xmlXPathCompFilterExpr(ctxt);
    if (ctxt->error != 0) {
      return;
    }
    if ((*ctxt->cur == '/') && (ctxt->cur[1] == '/')) {
      ctxt->cur = ctxt->cur + 2;
      while( true ) {
        bVar4 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar4 = true, 10 < *ctxt->cur)))) {
          bVar4 = *ctxt->cur == '\r';
        }
        if (!bVar4) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
      xmlXPathCompRelativeLocationPath(ctxt);
    }
    else if (*ctxt->cur == '/') {
      xmlXPathCompRelativeLocationPath(ctxt);
    }
  }
  while( true ) {
    bVar4 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar4 = true, 10 < *ctxt->cur)))) {
      bVar4 = *ctxt->cur == '\r';
    }
    if (!bVar4) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt) {
    int lc = 1;           /* Should we branch to LocationPath ?         */
    xmlChar *name = NULL; /* we may have to preparse a name to find out */

    SKIP_BLANKS;
    if ((CUR == '$') || (CUR == '(') ||
	(IS_ASCII_DIGIT(CUR)) ||
        (CUR == '\'') || (CUR == '"') ||
	(CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	lc = 0;
    } else if (CUR == '*') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '/') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '@') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else if (CUR == '.') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else {
	/*
	 * Problem is finding if we have a name here whether it's:
	 *   - a nodetype
	 *   - a function call in which case it's followed by '('
	 *   - an axis in which case it's followed by ':'
	 *   - a element name
	 * We do an a priori analysis here rather than having to
	 * maintain parsed token content through the recursive function
	 * calls. This looks uglier but makes the code easier to
	 * read/write/debug.
	 */
	SKIP_BLANKS;
	name = xmlXPathScanName(ctxt);
	if ((name != NULL) && (xmlStrstr(name, (xmlChar *) "::") != NULL)) {
#ifdef DEBUG_STEP
	    xmlGenericError(xmlGenericErrorContext,
		    "PathExpr: Axis\n");
#endif
	    lc = 1;
	    xmlFree(name);
	} else if (name != NULL) {
	    int len =xmlStrlen(name);


	    while (NXT(len) != 0) {
		if (NXT(len) == '/') {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if (IS_BLANK_CH(NXT(len))) {
		    /* ignore blanks */
		    ;
		} else if (NXT(len) == ':') {
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '(')) {
		    /* Node Type or Function */
		    if (xmlXPathIsNodeType(name)) {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: Type search\n");
#endif
			lc = 1;
#ifdef LIBXML_XPTR_LOCS_ENABLED
                    } else if (ctxt->xptr &&
                               xmlStrEqual(name, BAD_CAST "range-to")) {
                        lc = 1;
#endif
		    } else {
#ifdef DEBUG_STEP
		        xmlGenericError(xmlGenericErrorContext,
				"PathExpr: function call\n");
#endif
			lc = 0;
		    }
                    break;
		} else if ((NXT(len) == '[')) {
		    /* element name */
#ifdef DEBUG_STEP
		    xmlGenericError(xmlGenericErrorContext,
			    "PathExpr: AbbrRelLocation\n");
#endif
		    lc = 1;
		    break;
		} else if ((NXT(len) == '<') || (NXT(len) == '>') ||
			   (NXT(len) == '=')) {
		    lc = 1;
		    break;
		} else {
		    lc = 1;
		    break;
		}
		len++;
	    }
	    if (NXT(len) == 0) {
#ifdef DEBUG_STEP
		xmlGenericError(xmlGenericErrorContext,
			"PathExpr: AbbrRelLocation\n");
#endif
		/* element name */
		lc = 1;
	    }
	    xmlFree(name);
	} else {
	    /* make sure all cases are covered explicitly */
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
    }

    if (lc) {
	if (CUR == '/') {
	    PUSH_LEAVE_EXPR(XPATH_OP_ROOT, 0, 0);
	} else {
	    PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);
	}
	xmlXPathCompLocationPath(ctxt);
    } else {
	xmlXPathCompFilterExpr(ctxt);
	CHECK_ERROR;
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;

	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);

	    xmlXPathCompRelativeLocationPath(ctxt);
	} else if (CUR == '/') {
	    xmlXPathCompRelativeLocationPath(ctxt);
	}
    }
    SKIP_BLANKS;
}